

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3::SetDataRecords
          (IFF_Layer3 *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *DRS)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  int iVar4;
  pointer pKVar5;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::operator=(&this->m_vStdVarRecs,DRS);
  (this->super_LayerHeader).m_ui16LayerLength = 0x1c;
  pKVar5 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar5 == pKVar2) {
    iVar4 = (int)pKVar5;
  }
  else {
    do {
      KVar3 = StandardVariable::GetRecordLength(pKVar5->m_pRef);
      pKVar1 = &(this->super_LayerHeader).m_ui16LayerLength;
      *pKVar1 = *pKVar1 + KVar3;
      pKVar5 = pKVar5 + 1;
    } while (pKVar5 != pKVar2);
    pKVar5 = (this->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (int)(this->m_vStdVarRecs).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->m_ui16NumIffRecs = (short)((uint)(iVar4 - (int)pKVar5) >> 3) * -0x5555;
  return;
}

Assistant:

void IFF_Layer3::SetDataRecords( const std::vector<StdVarPtr> & DRS )
{
	m_vStdVarRecs = DRS;

    // Reset the PDU length.
	m_ui16LayerLength = IFF_LAYER3_SIZE;

    // Calculate the new length.
    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16LayerLength += ( *citr )->GetRecordLength();
    }

    m_ui16NumIffRecs = m_vStdVarRecs.size();
}